

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ExpressionResultBuilder * __thiscall
Catch::ExpressionResultBuilder::operator=
          (ExpressionResultBuilder *this,ExpressionResultBuilder *other)

{
  allocator local_41;
  string local_40 [32];
  
  AssertionResultData::operator=(&this->m_data,&other->m_data);
  ExprComponents::operator=(&this->m_exprComponents,&other->m_exprComponents);
  std::__cxx11::string::string(local_40,"",&local_41);
  std::__cxx11::stringbuf::str((string *)&this->field_0xb8);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&this->m_stream,local_40);
  std::__cxx11::string::~string(local_40);
  return this;
}

Assistant:

ExpressionResultBuilder& ExpressionResultBuilder::operator=(ExpressionResultBuilder const& other ) {
        m_data = other.m_data;
        m_exprComponents = other.m_exprComponents;
        m_stream.str("");
        m_stream << other.m_stream.str();
        return *this;
    }